

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O2

char __thiscall TextProviderString::advance(TextProviderString *this)

{
  optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int *piVar1;
  bool bVar2;
  char cVar3;
  _Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var4;
  element_type *peVar5;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var7;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  
  bVar2 = (this->m_iterator).
          super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_engaged;
  if (bVar2 == false) {
    _Var4 = (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             )(this->m_text)._M_dataplus._M_p;
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_engaged = true;
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload = _Var4;
  }
  iVar6 = (*(this->super_TextProvider)._vptr_TextProvider[2])(this);
  if ((char)iVar6 != '\0') {
    this_00 = &this->m_iterator;
    piVar1 = &(this->super_TextProvider).m_current_char_idx;
    *piVar1 = *piVar1 + 1;
    if (bVar2 != false) {
      p_Var7 = std::
               optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(this_00);
      p_Var7->_M_current = p_Var7->_M_current + 1;
    }
    p_Var7 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(this_00);
    if (p_Var7->_M_current != (this->m_text)._M_dataplus._M_p + (this->m_text)._M_string_length) {
      p_Var7 = std::
               optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(this_00);
      cVar3 = *p_Var7->_M_current;
      (this->super_TextProvider).m_current_char = cVar3;
      if (-1 < cVar3) {
        return cVar3;
      }
      peVar5 = (this->super_TextProvider).m_logger.
               super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string
                (local_38,(string *)&TextProvider::m_parser_text_provider_log_cat_abi_cxx11_);
      std::__cxx11::to_string(&sStack_98,(this->super_TextProvider).m_current_char_idx);
      std::operator+(&local_78,"detected non ascii character ( n : ",&sStack_98);
      std::operator+(&local_58,&local_78,
                     ". this interpreter does not yet support unicode files, sorry :/");
      (*peVar5->_vptr_PSLogger[2])(peVar5,4,local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&sStack_98);
      std::__cxx11::string::~string(local_38);
      (this->super_TextProvider).m_has_error = true;
      return (this->super_TextProvider).m_current_char;
    }
  }
  (this->super_TextProvider).m_current_char = '\0';
  return '\0';
}

Assistant:

char TextProviderString::advance()
{
	//todo this is probably the wrong way to deal with the fact that contrary to the "get" method on the file, the iterator already points to a valid char if the text is not empty but I'm too tired so this'll work for now.
	//todo it's ugly though and it makes "peek" unusable before "advance". Also, using "reverse" until the beggining of the string would mess it all
	bool avoid_iterator_increment = false;

	if(!m_iterator.has_value())
	{
		m_iterator = m_text.begin();
		avoid_iterator_increment = true;
	}

	if(is_valid())
	{
		++m_current_char_idx;

		if(!avoid_iterator_increment)
		{
			++m_iterator.value();
		}

		if(m_iterator.value() != m_text.end())
		{
			m_current_char = *m_iterator.value();
		}
		else
		{
			m_current_char = '\0';
		}

		if( static_cast<unsigned char>(m_current_char) > 127)
		{
			m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"detected non ascii character ( n : "+to_string(m_current_char_idx)+". this interpreter does not yet support unicode files, sorry :/");
			//todo add a line counter in this class to make these function return the correct line
			m_has_error = true;
		}
	}
	else
	{
		m_current_char = '\0';
	}
	return m_current_char;
}